

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O3

int launch(nvamemtiming_conf *conf,FILE *outf,uint8_t progression,color color)

{
  ushort uVar1;
  uint8_t *puVar2;
  uint uVar3;
  __time_t _Var4;
  __time_t _Var5;
  int iVar6;
  __pid_t _Var7;
  int extraout_EAX;
  uint uVar8;
  Display *dpy;
  FILE *pFVar9;
  undefined7 in_register_00000011;
  undefined1 *ref_val;
  char *pcVar10;
  uint32_t reg;
  uint32_t regs_len;
  ulong uVar11;
  nvamemtiming_conf *pnVar12;
  color color_00;
  bool bVar13;
  int cur_perflvl;
  timeval tv;
  char acStackY_100 [32];
  code *pcStackY_e0;
  uint local_c0;
  bool local_bc;
  nvamemtiming_conf *local_b8;
  color local_ac;
  uint local_a8;
  int local_a4;
  FILE *local_a0;
  timeval local_98 [6];
  
  pcStackY_e0 = (code *)0x103204;
  printf("--- Start sequence number %u\n",CONCAT71(in_register_00000011,progression) & 0xffffffff);
  pcStackY_e0 = (code *)0x103210;
  iVar6 = system("rmmod nvidia");
  if (iVar6 == 0x7f) {
    pcStackY_e0 = (code *)0x103847;
    launch_cold_15();
LAB_00103847:
    pcStackY_e0 = (code *)0x10384c;
    launch_cold_1();
LAB_0010384c:
    pcStackY_e0 = (code *)0x103851;
    launch_cold_7();
LAB_00103851:
    pcStackY_e0 = (code *)0x103856;
    launch_cold_6();
  }
  else {
    pcStackY_e0 = (code *)0x10322a;
    iVar6 = vbios_upload_pramin(conf->cnum,(conf->vbios).data,(uint)(conf->vbios).length);
    if (iVar6 != 1) goto LAB_00103847;
    pcStackY_e0 = (code *)0x10324b;
    setenv("DISPLAY",":0",1);
    if (conf->mmiotrace == false) {
LAB_00103304:
      pcStackY_e0 = (code *)0x103309;
      _Var7 = fork();
      if (_Var7 != -1) {
        if (_Var7 != 0) {
          local_a8 = (uint)(conf->timing).perflvl;
          local_bc = conf->mmiotrace;
          uVar8 = 0;
          do {
            pcStackY_e0 = (code *)0x103337;
            usleep(10000);
            pcStackY_e0 = (code *)0x10333e;
            dpy = (Display *)XOpenDisplay(0);
            if (dpy != (Display *)0x0) break;
            bVar13 = uVar8 < 199;
            uVar8 = uVar8 + 1;
          } while (bVar13);
          pcStackY_e0 = (code *)0x103373;
          fwrite("-- Display opened\n",0x12,1,_stderr);
          if (dpy == (Display *)0x0) {
            pcStackY_e0 = (code *)0x10337d;
            launch_cold_14();
            return extraout_EAX;
          }
          local_c0 = 0xffffffff;
          pcStackY_e0 = (code *)0x1033ab;
          local_ac = color;
          local_a0 = (FILE *)outf;
          gettimeofday(local_98,(__timezone_ptr_t)0x0);
          _Var4 = local_98[0].tv_sec;
          pcStackY_e0 = (code *)0x1033c6;
          XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x109,(int *)&local_c0);
          pcStackY_e0 = (code *)0x1033cb;
          _Var7 = fork();
          if (_Var7 == -1) {
            pcStackY_e0 = shallow_dump;
            launch_cold_8();
            pcStackY_e0 = (code *)_Var4;
            builtin_strncpy(acStackY_100,"regs_timing",0xc);
            pFVar9 = fopen(acStackY_100,"wb");
            if (pFVar9 != (FILE *)0x0) {
              shallow_dump_cold_1();
            }
            else {
              perror("Open regs_timing");
            }
            return (uint)(pFVar9 == (FILE *)0x0);
          }
          local_b8 = conf;
          if (_Var7 != 0) {
            pcStackY_e0 = (code *)0x1033ee;
            sleep(1);
            do {
              pcStackY_e0 = (code *)0x103406;
              usleep(10000);
              pcStackY_e0 = (code *)0x103410;
              gettimeofday(local_98,(__timezone_ptr_t)0x0);
              _Var5 = local_98[0].tv_sec;
              pcStackY_e0 = (code *)0x10342c;
              XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x107,&local_a4);
              if (local_a4 == 1) break;
            } while (_Var4 + 2U < (ulong)_Var5);
            pcStackY_e0 = (code *)0x103445;
            kill(_Var7,0xf);
            pcStackY_e0 = (code *)0x103451;
            waitpid(_Var7,(int *)0x0,0);
            uVar11 = CONCAT71((uint7)(uint3)((uint)_Var7 >> 8),1);
            if (local_bc != false) {
              pcStackY_e0 = (code *)0x10346e;
              iVar6 = write_to_file("/sys/kernel/debug/tracing/trace_marker","Start downclocking\n")
              ;
              if (iVar6 != 0) {
                pcStackY_e0 = (code *)0x103477;
                launch_cold_9();
                uVar11 = 0;
              }
            }
            pcStackY_e0 = (code *)0x103489;
            gettimeofday(local_98,(__timezone_ptr_t)0x0);
            _Var4 = local_98[0].tv_sec;
            pcStackY_e0 = (code *)0x1034ac;
            fwrite("XNVCTRLQueryTargetAttribute\n",0x1c,1,_stderr);
            pcStackY_e0 = (code *)0x1034cb;
            XNVCTRLQueryTargetAttribute(dpy,1,0,0,0x10a,(int *)&local_c0);
            if (local_c0 == 1) {
              local_bc = (bool)uVar11;
              uVar8 = 0xffffffff;
              do {
                pcStackY_e0 = (code *)0x1034f8;
                gettimeofday(local_98,(__timezone_ptr_t)0x0);
                if (_Var4 + 0x3cU < (ulong)local_98[0].tv_sec) {
                  pcStackY_e0 = (code *)0x103564;
                  launch_cold_12();
                  uVar11 = (ulong)local_bc;
                  goto LAB_00103572;
                }
                pcStackY_e0 = (code *)0x103516;
                XNVCTRLQueryTargetAttribute(dpy,0,0,0,0x109,(int *)&local_c0);
                uVar3 = local_c0;
                pcVar10 = "NV_CTRL_GPU_CURRENT_PERFORMANCE_LEVEL = %d\n";
                if (((int)uVar8 < 0) ||
                   (pcVar10 = "Changed NV_CTRL_GPU_CURRENT_PERFORMANCE_LEVEL = %d\n",
                   local_c0 != uVar8)) {
                  pcStackY_e0 = (code *)0x10354a;
                  fprintf(_stderr,pcVar10,(ulong)local_c0);
                  uVar8 = uVar3;
                }
              } while (uVar8 != local_a8);
              pcStackY_e0 = (code *)0x1035c2;
              launch_cold_11();
              pnVar12 = local_b8;
            }
            else {
              pcStackY_e0 = (code *)0x103554;
              launch_cold_10();
LAB_00103572:
              pnVar12 = local_b8;
              pcStackY_e0 = (code *)0x10357c;
              sleep(1);
              pcStackY_e0 = (code *)0x103584;
              XCloseDisplay(dpy);
              pFVar9 = _stderr;
              pcStackY_e0 = (code *)0x103593;
              uVar8 = getpid();
              pcStackY_e0 = (code *)0x1035a6;
              iVar6 = fprintf(pFVar9,"-- Display closed (pid = %i)\n",(ulong)uVar8);
              if ((char)uVar11 == '\0') {
                return iVar6;
              }
            }
            if (pnVar12->mmiotrace != false) {
              pcStackY_e0 = (code *)0x1035e5;
              iVar6 = write_to_file("/sys/kernel/debug/tracing/current_tracer","nop");
              if (iVar6 != 0) {
                pcStackY_e0 = (code *)0x10383d;
                launch_cold_13();
              }
              pcStackY_e0 = (code *)0x1035f9;
              puts("mmiotrace stopped");
            }
            pFVar9 = local_a0;
            uVar1 = (pnVar12->vbios).timing_entry_offset;
            puVar2 = (pnVar12->vbios).data;
            pcStackY_e0 = (code *)0x103624;
            fprintf(local_a0,"timing entry [%u/%u]: ",(ulong)(uint)(int)(char)progression,
                    (ulong)(pnVar12->vbios).timing_entry_length);
            if ((pnVar12->vbios).timing_entry_length != 0) {
              uVar11 = 0;
              do {
                pcVar10 = "%02x ";
                if ((int)(char)progression - 1 == uVar11) {
                  pcVar10 = "\x1b[0;31m%02x\x1b[0m ";
                }
                pcStackY_e0 = (code *)0x103659;
                fprintf(pFVar9,pcVar10,(ulong)puVar2[uVar11 + uVar1]);
                uVar11 = uVar11 + 1;
              } while (uVar11 < (pnVar12->vbios).timing_entry_length);
            }
            pcStackY_e0 = (code *)0x103673;
            fputc(10,pFVar9);
            iVar6 = pnVar12->cnum;
            bVar13 = '\0' < (char)progression && local_ac != NO_COLOR;
            if (nva_cards[iVar6].card_type < 0xc0) {
              color_00 = (color)bVar13;
              pcStackY_e0 = (code *)0x10376d;
              dump_regs(iVar6,(FILE *)pFVar9,(uint32_t *)dump_timings_ref_val1,
                        (uint)dump_timings_ref_exist,0x100220,0x30,color_00);
              pcStackY_e0 = (code *)0x103795;
              dump_regs(pnVar12->cnum,(FILE *)pFVar9,(uint32_t *)dump_timings_ref_val2,
                        (uint)dump_timings_ref_exist,0x1002c0,0x30,color_00);
              pcStackY_e0 = (code *)0x1037bd;
              dump_regs(pnVar12->cnum,(FILE *)pFVar9,(uint32_t *)dump_timings_ref_val3,
                        (uint)dump_timings_ref_exist,0x100510,0x10,color_00);
              iVar6 = pnVar12->cnum;
              ref_val = dump_timings_ref_val4;
              reg = 0x100710;
              regs_len = 0x10;
            }
            else {
              pcStackY_e0 = (code *)0x1036d6;
              dump_regs(iVar6,(FILE *)pFVar9,(uint32_t *)dump_timings_ref_val3,
                        (uint)dump_timings_ref_exist,0x10f240,0x20,(uint)bVar13);
              pcStackY_e0 = (code *)0x1036fe;
              dump_regs(pnVar12->cnum,(FILE *)pFVar9,(uint32_t *)dump_timings_ref_val1,
                        (uint)dump_timings_ref_exist,0x10f290,0xa0,(uint)bVar13);
              pcStackY_e0 = (code *)0x103726;
              dump_regs(pnVar12->cnum,(FILE *)pFVar9,(uint32_t *)dump_timings_ref_val4,
                        (uint)dump_timings_ref_exist,0x10f610,0x10,(uint)bVar13);
              iVar6 = pnVar12->cnum;
              ref_val = dump_timings_ref_val2;
              reg = 0x10f720;
              regs_len = 0x20;
            }
            pcStackY_e0 = (code *)0x1037e5;
            dump_regs(iVar6,(FILE *)pFVar9,(uint32_t *)ref_val,(uint)dump_timings_ref_exist,reg,
                      regs_len,(uint)bVar13);
            pcStackY_e0 = (code *)0x1037f2;
            fputc(10,pFVar9);
            pcStackY_e0 = (code *)0x1037fa;
            fflush(pFVar9);
            dump_timings_ref_exist = 1;
            pcStackY_e0 = (code *)0x10380d;
            system("killall X");
            do {
              pcStackY_e0 = (code *)0x103814;
              _Var7 = wait((void *)0x0);
            } while (0 < _Var7);
            pnVar12->counter = pnVar12->counter + 1;
            pcStackY_e0 = (code *)0x103826;
            uVar8 = sleep(5);
            return uVar8;
          }
          pcVar10 = "timeout 3 glxgears";
          goto LAB_0010387f;
        }
        goto LAB_0010384c;
      }
      goto LAB_00103851;
    }
    pcStackY_e0 = (code *)0x103271;
    iVar6 = mount("debugfs","/sys/kernel/debug","debugfs",0,(void *)0x0);
    if (iVar6 != 0) {
      pcStackY_e0 = (code *)0x103280;
      launch_cold_2();
    }
    pcStackY_e0 = (code *)0x103293;
    iVar6 = write_to_file("/sys/kernel/debug/tracing/buffer_size_kb","128000");
    if (iVar6 != 0) {
      pcStackY_e0 = (code *)0x10329f;
      launch_cold_3();
    }
    pcStackY_e0 = (code *)0x1032b2;
    iVar6 = write_to_file("/sys/kernel/debug/tracing/current_tracer","mmiotrace");
    if (iVar6 != 0) {
      pcStackY_e0 = (code *)0x1032be;
      launch_cold_4();
    }
    pcStackY_e0 = (code *)0x1032d1;
    iVar6 = write_to_file("/sys/kernel/debug/tracing/current_tracer","mmiotrace");
    if (iVar6 != 0) {
      pcStackY_e0 = (code *)0x1032dd;
      launch_cold_5();
    }
    pcStackY_e0 = (code *)0x1032e2;
    _Var7 = fork();
    if (_Var7 != 0) {
      if (_Var7 < 0) {
        pcStackY_e0 = (code *)0x1032f8;
        perror("fork");
      }
      pcStackY_e0 = (code *)0x103304;
      puts("mmiotrace started");
      goto LAB_00103304;
    }
  }
  pcVar10 = (char *)local_98;
  pcStackY_e0 = (code *)0x103873;
  snprintf(pcVar10,100,"cat /sys/kernel/debug/tracing/trace_pipe > mmt_entry_%i",
           CONCAT71(in_register_00000011,progression) & 0xffffffff);
LAB_0010387f:
  pcStackY_e0 = (code *)0x103884;
  iVar6 = system(pcVar10);
  pcStackY_e0 = (code *)0x10388b;
  exit(iVar6);
}

Assistant:

static int
launch(struct nvamemtiming_conf *conf, FILE *outf, uint8_t progression, enum color color)
{
	printf("--- Start sequence number %u\n", progression);

	if (system("rmmod nvidia") == 127)
	{
		fprintf(stderr, "rmmod not found. Abort\n");
		exit (2);
	}

	if (vbios_upload_pramin(conf->cnum, conf->vbios.data, conf->vbios.length) != 1)
	{
		fprintf(stderr, "upload failed. Abort\n");
		exit(3);
	}

	/* modify our env so as we can launch apps on X */
	setenv("DISPLAY", ":0", 1);

	/* monitor downclocking */
	if (conf->mmiotrace)
		mmiotrace_start(progression);

	pid_t pid = fork();
	if (pid == 0) {
		system("killall X 2> /dev/null > /dev/null");
		system("X > /dev/null 2> /dev/null");
		fprintf(stderr, "X exited, let's quit!\n");
		exit(0);
	} else if (pid == -1) {
		fprintf(stderr, "Fork failed! Abort\n");
		exit (4);
	}

	/* X runs, wait for the right perflvl to be selected */
	if (force_timing_changes(conf->timing.perflvl, conf->mmiotrace))
		return 1;

	if (conf->mmiotrace)
                mmiotrace_stop();

	dump_timings(conf, outf, progression, color);

	system("killall X");

	/* wait for all zombie processes */
	while(wait(NULL) > 0);

	/* increase the launch counter */
	conf->counter++;

	/* wait for the nvidia driver to modeset back to the crappy resolution */
	sleep(5);

	return 0;
}